

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ini.c
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  int iVar3;
  sx_alloc *alloc;
  sx_ini *ini;
  char *pcVar4;
  char *pcVar5;
  
  alloc = sx_alloc_malloc();
  ini = sx_ini_load("global_var=hello world\n[general]\nscreen_width=12\nscreen_height=64\ndata_path=/usr/septag\n; some comment about this section\n[sx]\nis_library=1\n"
                    ,alloc);
  if (ini == (sx_ini *)0x0) {
    puts("Loading ini data failed");
    iVar1 = -1;
  }
  else {
    iVar1 = sx_ini_section_count(ini);
    if (0 < iVar1) {
      iVar1 = 0;
      do {
        pcVar4 = sx_ini_section_name(ini,iVar1);
        printf("Section: %s\n",pcVar4);
        iVar2 = sx_ini_property_count(ini,iVar1);
        if (0 < iVar2) {
          iVar2 = 0;
          do {
            pcVar4 = sx_ini_property_name(ini,iVar1,iVar2);
            pcVar5 = sx_ini_property_value(ini,iVar1,iVar2);
            printf("\t%s = %s\n",pcVar4,pcVar5);
            iVar2 = iVar2 + 1;
            iVar3 = sx_ini_property_count(ini,iVar1);
          } while (iVar2 < iVar3);
        }
        iVar1 = iVar1 + 1;
        iVar2 = sx_ini_section_count(ini);
      } while (iVar1 < iVar2);
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int main(int argc, char* argv[])
{
    const sx_alloc* alloc = sx_alloc_malloc();
    sx_ini* ini = sx_ini_load(ini_data, alloc);
    if (!ini) {
        puts("Loading ini data failed");
        return -1;
    }

    for (int i = 0; i < sx_ini_section_count(ini); i++) {
        printf("Section: %s\n", sx_ini_section_name(ini, i));
        for (int k = 0; k < sx_ini_property_count(ini, i); k++) {
            printf("\t%s = %s\n", sx_ini_property_name(ini, i, k),
                   sx_ini_property_value(ini, i, k));
        }
    }

    return 0;
}